

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

bool CoreML::hasIOS12Features(Model *model)

{
  uint32 uVar1;
  int iVar2;
  Rep *pRVar3;
  bool bVar4;
  Pipeline *pPVar5;
  PipelineRegressor *pPVar6;
  PipelineClassifier *pPVar7;
  long lVar8;
  void **ppvVar9;
  bool bVar10;
  
  uVar1 = model->_oneof_case_[0];
  if (uVar1 == 200) {
    pPVar7 = Specification::Model::pipelineclassifier(model);
    pPVar5 = pPVar7->pipeline_;
    if (pPVar5 == (Pipeline *)0x0) {
      pPVar5 = (Pipeline *)&Specification::_Pipeline_default_instance_;
    }
    pRVar3 = (pPVar5->models_).super_RepeatedPtrFieldBase.rep_;
    ppvVar9 = pRVar3->elements;
    if (pRVar3 == (Rep *)0x0) {
      ppvVar9 = (void **)0x0;
    }
    iVar2 = (pPVar5->models_).super_RepeatedPtrFieldBase.current_size_;
    lVar8 = 0;
    do {
      bVar10 = (long)iVar2 * 8 == lVar8;
      bVar4 = !bVar10;
      if (bVar10) {
        return bVar4;
      }
      bVar10 = hasIOS12Features(*(Model **)((long)ppvVar9 + lVar8));
      lVar8 = lVar8 + 8;
    } while (!bVar10);
  }
  else if (uVar1 == 0xc9) {
    pPVar6 = Specification::Model::pipelineregressor(model);
    pPVar5 = pPVar6->pipeline_;
    if (pPVar5 == (Pipeline *)0x0) {
      pPVar5 = (Pipeline *)&Specification::_Pipeline_default_instance_;
    }
    pRVar3 = (pPVar5->models_).super_RepeatedPtrFieldBase.rep_;
    ppvVar9 = pRVar3->elements;
    if (pRVar3 == (Rep *)0x0) {
      ppvVar9 = (void **)0x0;
    }
    iVar2 = (pPVar5->models_).super_RepeatedPtrFieldBase.current_size_;
    lVar8 = 0;
    do {
      bVar10 = (long)iVar2 * 8 == lVar8;
      bVar4 = !bVar10;
      if (bVar10) {
        return bVar4;
      }
      bVar10 = hasIOS12Features(*(Model **)((long)ppvVar9 + lVar8));
      lVar8 = lVar8 + 8;
    } while (!bVar10);
  }
  else if (uVar1 == 0xca) {
    pPVar5 = Specification::Model::pipeline(model);
    pRVar3 = (pPVar5->models_).super_RepeatedPtrFieldBase.rep_;
    ppvVar9 = pRVar3->elements;
    if (pRVar3 == (Rep *)0x0) {
      ppvVar9 = (void **)0x0;
    }
    iVar2 = (pPVar5->models_).super_RepeatedPtrFieldBase.current_size_;
    lVar8 = 0;
    do {
      bVar10 = (long)iVar2 * 8 == lVar8;
      bVar4 = !bVar10;
      if (bVar10) {
        return bVar4;
      }
      bVar10 = hasIOS12Features(*(Model **)((long)ppvVar9 + lVar8));
      lVar8 = lVar8 + 8;
    } while (!bVar10);
  }
  else {
    bVar10 = hasFlexibleShapes(model);
    bVar4 = true;
    if (((((!bVar10) && (model->_oneof_case_[0] != 0x22b)) &&
         (bVar10 = hasCategoricalSequences(model), !bVar10)) &&
        (((model->_oneof_case_[0] & 0xfffffffe) != 2000 && (bVar10 = hasScenePrint(model), !bVar10))
        )) && ((bVar10 = hasUnsignedQuantizedWeights(model), !bVar10 &&
               ((model->_oneof_case_[0] != 0x130 && (model->_oneof_case_[0] != 0x262)))))) {
      bVar4 = hasIOS12NewNeuralNetworkLayers(model);
      return bVar4;
    }
  }
  return bVar4;
}

Assistant:

bool CoreML::hasIOS12Features(const Specification::Model& model) {
    // New IOS12 features: flexible shapes, custom model, sequence feature type,
    // text classifier, word tagger, vision feature print, unsigned integer quantization
    bool result = false;
    switch (model.Type_case()) {
        case Specification::Model::kPipeline:
            for (auto &m : model.pipeline().models()) {
                result = result || hasIOS12Features(m);
                if (result) {
                    return true;
                }
            }
            break;
        case Specification::Model::kPipelineRegressor:
            for (auto &m : model.pipelineregressor().pipeline().models()) {
                result = result ||hasIOS12Features(m);
                if (result) {
                    return true;
                }
            }
            break;
        case Specification::Model::kPipelineClassifier:
            for (auto &m : model.pipelineclassifier().pipeline().models()) {
                result = result || hasIOS12Features(m);
                if (result) {
                    return true;
                }
            }
            break;
        default:
            return (hasFlexibleShapes(model) || hasCustomModel(model) || hasCategoricalSequences(model) ||
                    hasAppleTextClassifier(model) || hasAppleWordTagger(model) ||
                    hasScenePrint(model) || hasUnsignedQuantizedWeights(model) ||
                    hasNonmaxSuppression(model) || hasBayesianProbitRegressor(model) ||
                    hasIOS12NewNeuralNetworkLayers(model));
    }
    return false;
}